

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_in_out.cpp
# Opt level: O2

void ThrottlingSum::Register(Connection *con)

{
  TableFunction TVar1;
  type pCVar2;
  ClientContext *pCVar3;
  initializer_list<duckdb::LogicalType> __l;
  undefined1 auStack_580 [40];
  string local_558 [32];
  CreateTableFunctionInfo caching_table_in_out_info;
  TableFunction local_380;
  TableFunction caching_table_in_out;
  
  duckdb::Connection::BeginTransaction();
  pCVar2 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)con);
  pCVar3 = (ClientContext *)duckdb::Catalog::GetSystemCatalog(pCVar2);
  std::__cxx11::string::string(local_558,"throttling_sum",(allocator *)(auStack_580 + 0xf));
  duckdb::LogicalType::LogicalType((LogicalType *)&caching_table_in_out_info,TABLE);
  __l._M_len = 1;
  __l._M_array = (iterator)&caching_table_in_out_info;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             (auStack_580 + 0x10),__l,(allocator_type *)(auStack_580 + 0xe));
  duckdb::TableFunction::TableFunction
            (&caching_table_in_out,local_558,auStack_580 + 0x10,0,Bind,ThrottlingSumGlobalInit);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             (auStack_580 + 0x10));
  duckdb::LogicalType::~LogicalType((LogicalType *)&caching_table_in_out_info);
  std::__cxx11::string::~string(local_558);
  caching_table_in_out.in_out_function = Function;
  caching_table_in_out.in_out_function_final = Finalize;
  duckdb::TableFunction::TableFunction(&local_380,&caching_table_in_out);
  TVar1._8_432_ = _auStack_580;
  TVar1._0_8_ = ThrottlingSumLocalInit;
  duckdb::CreateTableFunctionInfo::CreateTableFunctionInfo(&caching_table_in_out_info,TVar1);
  duckdb::TableFunction::~TableFunction(&local_380);
  pCVar2 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)con);
  duckdb::Catalog::CreateTableFunction(pCVar3,(CreateTableFunctionInfo *)pCVar2);
  duckdb::Connection::Commit();
  duckdb::CreateTableFunctionInfo::~CreateTableFunctionInfo(&caching_table_in_out_info);
  duckdb::TableFunction::~TableFunction(&caching_table_in_out);
  return;
}

Assistant:

static void Register(Connection &con) {
		// Create our test TableFunction
		con.BeginTransaction();
		auto &client_context = *con.context;
		auto &catalog = Catalog::GetSystemCatalog(client_context);
		TableFunction caching_table_in_out("throttling_sum", {LogicalType::TABLE}, nullptr, ThrottlingSum::Bind,
		                                   ThrottlingSum::ThrottlingSumGlobalInit,
		                                   ThrottlingSum::ThrottlingSumLocalInit);
		caching_table_in_out.in_out_function = ThrottlingSum::Function;
		caching_table_in_out.in_out_function_final = ThrottlingSum::Finalize;
		CreateTableFunctionInfo caching_table_in_out_info(caching_table_in_out);
		catalog.CreateTableFunction(*con.context, caching_table_in_out_info);
		con.Commit();
	}